

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_slice.c
# Opt level: O3

MPP_RET process_slice(H264_SLICE_t *currSlice)

{
  bitread_ctx_t *bitctx;
  RecoveryPoint *pRVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  H264NalRefIdcType HVar6;
  RK_U32 RVar7;
  RK_U32 RVar8;
  h264d_cur_ctx_t *phVar9;
  H264dVideoCtx_t *p_Vid;
  h264_dec_ctx_t *phVar10;
  h264_pps_t *phVar11;
  h264_sps_t *phVar12;
  RK_S64 RVar13;
  MPP_RET MVar14;
  uint uVar15;
  h264_subsps_t *phVar16;
  h264d_video_ctx_t *phVar17;
  ulong uVar18;
  char *pcVar19;
  int iVar20;
  uint uVar21;
  RK_U32 *pRVar22;
  undefined8 uVar23;
  uint uVar24;
  uint uVar25;
  h264_subsps_t *phVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  RK_U32 _out;
  H264_PPS_t *local_40;
  h264_subsps_t *local_38;
  
  phVar9 = currSlice->p_Cur;
  phVar17 = currSlice->p_Vid;
  bitctx = &phVar9->bitctx;
  currSlice->p_Dpb_layer[0] = phVar17->p_Dpb_layer[0];
  currSlice->p_Dpb_layer[1] = phVar17->p_Dpb_layer[1];
  MVar14 = mpp_read_ue(bitctx,&_out);
  (phVar9->bitctx).ret = MVar14;
  if (MVar14 != MPP_OK) {
    return MVar14;
  }
  currSlice->start_mb_nr = _out;
  MVar14 = mpp_read_ue(bitctx,&_out);
  (phVar9->bitctx).ret = MVar14;
  if (MVar14 != MPP_OK) {
    return MVar14;
  }
  uVar15 = _out % 5;
  currSlice->slice_type = uVar15;
  phVar17->slice_type = uVar15;
  if (uVar15 - 3 < 2) {
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_ERR_UNKNOW;
    }
    _mpp_log_l(4,"h264d_slice","sp or si slice not support\n",(char *)0x0);
    return MPP_ERR_UNKNOW;
  }
  MVar14 = mpp_read_ue(bitctx,&_out);
  (phVar9->bitctx).ret = MVar14;
  if (MVar14 != MPP_OK) {
    return MVar14;
  }
  currSlice->pic_parameter_set_id = _out;
  p_Vid = currSlice->p_Vid;
  uVar15 = (uint)((currSlice->p_Cur->nalu).nalu_type == H264_NALU_TYPE_IDR);
  currSlice->idr_flag = uVar15;
  HVar6 = (currSlice->p_Cur->nalu).nal_reference_idc;
  currSlice->nal_reference_idc = HVar6;
  phVar10 = p_Vid->p_Dec;
  (phVar10->errctx).used_ref_flag = (uint)(HVar6 != H264_NALU_PRIORITY_DISPOSABLE);
  if (currSlice->slice_type == 2) {
    (phVar10->errctx).dpb_err_flag = 0;
  }
  if ((currSlice->svc_extension_flag == 0) || ((currSlice->mvcExt).iPrefixNALU != 0)) {
    uVar15 = (currSlice->mvcExt).view_id;
    pRVar22 = (RK_U32 *)(ulong)uVar15;
    currSlice->view_id = uVar15;
    RVar7 = (currSlice->mvcExt).inter_view_flag;
    currSlice->anchor_pic_flag = (currSlice->mvcExt).anchor_pic_flag;
    currSlice->inter_view_flag = RVar7;
  }
  else if (currSlice->svc_extension_flag == -1) {
    if ((currSlice->mvcExt).valid == 0) {
      uVar25 = 0;
    }
    else {
      uVar25 = *p_Vid->active_subsps->view_id;
    }
    pRVar22 = (RK_U32 *)(ulong)uVar25;
    currSlice->view_id = uVar25;
    currSlice->inter_view_flag = 1;
    currSlice->anchor_pic_flag = uVar15;
  }
  else {
    pRVar22 = (RK_U32 *)(ulong)(uint)currSlice->view_id;
  }
  currSlice->layer_id = (int)pRVar22;
  if (-1 < (int)pRVar22) {
    currSlice->p_Dpb = p_Vid->p_Dpb_layer[(long)pRVar22];
  }
  if (((_out < 0x100) && (phVar11 = p_Vid->ppsSet[_out], phVar11 != (h264_pps_t *)0x0)) &&
     (phVar11->Valid != 0)) {
    if ((currSlice->mvcExt).valid == 0) {
      p_Vid->active_mvc_sps_flag = 0;
      uVar18 = (ulong)phVar11->seq_parameter_set_id;
LAB_0018db09:
      phVar26 = (h264_subsps_t *)p_Vid->spsSet[uVar18];
      if ((h264_subsps_t *)p_Vid->spsSet[uVar18] != (h264_subsps_t *)0x0) {
LAB_0018db16:
        uVar15 = (uint)uVar18;
        if ((phVar26->sps).Valid != 0) {
          phVar16 = (H264_subSPS_t *)0x0;
          goto LAB_0018db22;
        }
      }
      MVar14 = MPP_ERR_VALUE;
      if (((byte)h264d_debug & 4) != 0) {
        pcVar19 = "value error(%d).\n";
        uVar23 = 0x188;
        goto LAB_0018da8d;
      }
      goto LAB_0018da94;
    }
    uVar15 = phVar11->seq_parameter_set_id;
    uVar18 = (ulong)uVar15;
    phVar16 = p_Vid->subspsSet[uVar18];
    if (((phVar16 == (h264_subsps_t *)0x0) || (phVar16->Valid == 0)) ||
       (phVar16->num_views_minus1 < 1)) {
LAB_0018da50:
      p_Vid->active_mvc_sps_flag = 0;
      goto LAB_0018db09;
    }
    RVar7 = (currSlice->mvcExt).view_id;
    pRVar22 = (RK_U32 *)phVar16->view_id;
    if (RVar7 == *pRVar22) goto LAB_0018da50;
    phVar26 = phVar16;
    if (RVar7 != pRVar22[1]) {
      if (p_Vid->active_mvc_sps_flag != 0) goto LAB_0018db22;
      goto LAB_0018db16;
    }
    p_Vid->active_mvc_sps_flag = 1;
LAB_0018db22:
    uVar25 = (phVar26->sps).seq_parameter_set_id;
    uVar2 = (phVar26->sps).bit_depth_luma_minus8;
    uVar3 = (phVar26->sps).bit_depth_chroma_minus8;
    uVar4 = (phVar26->sps).log2_max_frame_num_minus4;
    uVar5 = (phVar26->sps).pic_order_cnt_type;
    auVar28._0_4_ = -(uint)(2 < (int)uVar2);
    auVar28._4_4_ = -(uint)(2 < (int)uVar3);
    auVar28._8_4_ = -(uint)(0xc < (int)uVar4);
    auVar28._12_4_ = -(uint)(2 < (int)uVar5);
    iVar20 = movmskps((int)pRVar22,auVar28);
    if (((iVar20 == 0) && ((phVar26->sps).chroma_format_idc < 3)) &&
       (((phVar26->sps).log2_max_pic_order_cnt_lsb_minus4 < 0xd &&
        (((((phVar26->sps).num_ref_frames_in_pic_order_cnt_cycle < 0x100 &&
           ((phVar26->sps).max_num_ref_frames < 0x11)) &&
          ((phVar26->sps).separate_colour_plane_flag != 1)) &&
         (((phVar26->sps).qpprime_y_zero_transform_bypass_flag != 1 && (uVar25 < 0x20)))))))) {
      if (phVar10->hw_info == (MppDecHwCap *)0x0) {
        uVar24 = 0x77;
      }
      else {
        uVar21 = (uint)*(undefined8 *)&phVar10->hw_info->field_0x4;
        if ((uVar21 >> 0xd & 1) == 0) {
          uVar24 = 0xff;
          if ((uVar21 >> 0xc & 1) == 0) {
            uVar24 = 0x77;
          }
        }
        else {
          uVar24 = (uVar21 >> 0x15 & 7) * 0x1ff;
        }
      }
      uVar21 = (phVar26->sps).pic_width_in_mbs_minus1;
      if ((int)uVar21 < 3) {
        if (((byte)h264d_debug & 1) != 0) {
          uVar24 = uVar21 * 0x10 + 0x10;
          pcVar19 = "sps %d too small width %d\n";
LAB_0018dcef:
          _mpp_log_l(4,"h264d_slice",pcVar19,(char *)0x0,(ulong)uVar25,(ulong)uVar24);
        }
        goto LAB_0018dcf6;
      }
      if (uVar24 < uVar21) {
        if (((byte)h264d_debug & 1) != 0) {
          uVar25 = uVar21 * 0x10 + 0x10;
          uVar24 = uVar24 << 4;
          pcVar19 = "width %d is larger than soc max support %d\n";
          goto LAB_0018dcef;
        }
        goto LAB_0018dcf6;
      }
      if (phVar16 != (H264_subSPS_t *)0x0) {
        bVar27 = phVar16->num_views_minus1 != 1;
        if (0 < *phVar16->num_anchor_refs_l0) {
          bVar27 = **phVar16->anchor_ref_l0 != *phVar16->view_id || phVar16->num_views_minus1 != 1;
        }
        if (0 < *phVar16->num_anchor_refs_l1) {
          bVar27 = (bool)(bVar27 | **phVar16->anchor_ref_l1 != phVar16->view_id[1]);
        }
        if (0 < *phVar16->num_non_anchor_refs_l0) {
          bVar27 = (bool)(bVar27 | **phVar16->non_anchor_ref_l0 != *phVar16->view_id);
        }
        if (0 < *phVar16->num_non_anchor_refs_l1) {
          bVar27 = (bool)(bVar27 | **phVar16->non_anchor_ref_l1 != phVar16->view_id[1]);
        }
        if (bVar27) {
          if (((byte)h264d_debug & 1) != 0) {
            pcVar19 = "subsps has error, sps_id=%d";
            goto LAB_0018dc20;
          }
          goto LAB_0018dcf6;
        }
      }
      uVar24 = phVar11->pic_parameter_set_id;
      if (((phVar11->redundant_pic_cnt_present_flag == 1) || (0x1f < uVar15)) ||
         ((((0xff < uVar24 ||
            (((0 < phVar11->num_slice_groups_minus1 ||
              (0x1f < phVar11->num_ref_idx_l0_default_active_minus1)) ||
             (0x1f < phVar11->num_ref_idx_l1_default_active_minus1)))) ||
           (((0x19 < phVar11->pic_init_qp_minus26 ||
             (phVar11->pic_init_qp_minus26 < uVar2 * -6 + -0x1a)) ||
            (phVar11->pic_init_qs_minus26 - 0x1aU < 0xffffffcc)))) ||
          (phVar11->chroma_qp_index_offset - 0xdU < 0xffffffe7)))) {
        if (((byte)h264d_debug & 1) != 0) {
          pcVar19 = "pps has error, sps_id=%d, pps_id";
          goto LAB_0018dcef;
        }
        goto LAB_0018dcf6;
      }
      local_40 = phVar11;
      local_38 = phVar26;
      MVar14 = activate_sps(p_Vid,&phVar26->sps,phVar16);
      if (MVar14 < MPP_OK) {
        if (((byte)h264d_debug & 4) != 0) {
          pcVar19 = "Function error(%d).\n";
          uVar23 = 0x18b;
          goto LAB_0018da8d;
        }
      }
      else {
        MVar14 = activate_pps(p_Vid,local_40);
        if (MPP_NOK < MVar14) {
          RVar7 = (local_38->sps).seq_parameter_set_id;
          RVar8 = local_40->pic_parameter_set_id;
          if ((p_Vid->last_sps_id != RVar7) || (p_Vid->last_pps_id != RVar8)) {
            p_Vid->last_sps_id = RVar7;
            p_Vid->last_pps_id = RVar8;
            p_Vid->spspps_update = 1;
          }
          if (p_Vid->p_Dec->mvc_valid != '\0') {
            phVar16 = p_Vid->subspsSet[local_40->seq_parameter_set_id];
            if ((phVar16 == (h264_subsps_t *)0x0) || (phVar16->Valid == 0)) {
              phVar16 = (h264_subsps_t *)0x0;
            }
            p_Vid->active_subsps = phVar16;
          }
          phVar12 = p_Vid->active_sps;
          currSlice->active_sps = phVar12;
          currSlice->active_pps = p_Vid->active_pps;
          p_Vid->type = currSlice->slice_type;
          MVar14 = mpp_read_bits(bitctx,phVar12->log2_max_frame_num_minus4 + 4,(RK_S32 *)&_out);
          (phVar9->bitctx).ret = MVar14;
          if (MVar14 != MPP_OK) {
            return MVar14;
          }
          pRVar1 = &phVar17->recovery;
          currSlice->frame_num = _out;
          if (pRVar1->valid_flag != 0) {
            if ((phVar17->recovery).first_frm_valid == 0) {
              (phVar17->recovery).first_frm_id = _out;
              (phVar17->recovery).first_frm_valid = 1;
              (phVar17->recovery).recovery_pic_id = (phVar17->recovery).recovery_frame_cnt + _out;
              if ((h264d_debug._1_1_ & 0x40) != 0) {
                _mpp_log_l(4,"h264d_slice","First recovery frame found, frame_num %d",(char *)0x0);
              }
            }
            else if ((phVar17->recovery).recovery_pic_id % phVar17->max_frame_num < (int)_out) {
              pRVar1->valid_flag = 0;
              pRVar1->recovery_frame_cnt = 0;
              pRVar1->first_frm_id = 0;
              pRVar1->first_frm_valid = 0;
              (phVar17->recovery).recovery_pic_id = 0;
            }
          }
          if (currSlice->active_sps->frame_mbs_only_flag == 0) {
            MVar14 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
            (phVar9->bitctx).ret = MVar14;
            if (MVar14 != MPP_OK) {
              return MVar14;
            }
            currSlice->field_pic_flag = _out;
            if (_out == 0) {
              phVar17->structure = 3;
              currSlice->bottom_field_flag = 0;
              goto LAB_0018e0f3;
            }
            MVar14 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
            (phVar9->bitctx).ret = MVar14;
            if (MVar14 != MPP_OK) {
              return MVar14;
            }
            currSlice->bottom_field_flag = _out;
            iVar20 = 2 - (uint)(_out == 0);
            phVar17->structure = iVar20;
          }
          else {
            phVar17->structure = 3;
            currSlice->field_pic_flag = 0;
            currSlice->bottom_field_flag = 0;
LAB_0018e0f3:
            iVar20 = 3;
          }
          currSlice->structure = iVar20;
          if (currSlice->active_sps->mb_adaptive_frame_field_flag == 0) {
            uVar15 = 0;
          }
          else {
            uVar15 = (uint)(currSlice->field_pic_flag == 0);
          }
          currSlice->mb_aff_frame_flag = uVar15;
          if ((currSlice->idr_flag != 0) ||
             ((currSlice->svc_extension_flag == 0 && ((currSlice->mvcExt).non_idr_flag == 0)))) {
            MVar14 = mpp_read_ue(bitctx,&_out);
            (phVar9->bitctx).ret = MVar14;
            if (MVar14 != MPP_OK) {
              return MVar14;
            }
            currSlice->idr_pic_id = _out;
          }
          iVar20 = (phVar9->bitctx).used_bits;
          RVar13 = (phVar9->bitctx).emulation_prevention_bytes_;
          if (currSlice->active_sps->pic_order_cnt_type == 0) {
            MVar14 = mpp_read_bits(bitctx,currSlice->active_sps->log2_max_pic_order_cnt_lsb_minus4 +
                                          4,(RK_S32 *)&_out);
            (phVar9->bitctx).ret = MVar14;
            if (MVar14 != MPP_OK) {
              return MVar14;
            }
            currSlice->pic_order_cnt_lsb = _out;
            if ((currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1) &&
               (currSlice->field_pic_flag == 0)) {
              MVar14 = mpp_read_se(bitctx,(RK_S32 *)&_out);
              (phVar9->bitctx).ret = MVar14;
              if (MVar14 != MPP_OK) {
                return MVar14;
              }
              currSlice->delta_pic_order_cnt_bottom = _out;
            }
            else {
              currSlice->delta_pic_order_cnt_bottom = 0;
            }
          }
          if (currSlice->active_sps->pic_order_cnt_type == 1) {
            if (currSlice->active_sps->delta_pic_order_always_zero_flag == 0) {
              MVar14 = mpp_read_se(bitctx,(RK_S32 *)&_out);
              (phVar9->bitctx).ret = MVar14;
              if (MVar14 != MPP_OK) {
                return MVar14;
              }
              currSlice->delta_pic_order_cnt[0] = _out;
              if ((currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1)
                 && (currSlice->field_pic_flag == 0)) {
                MVar14 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                (phVar9->bitctx).ret = MVar14;
                if (MVar14 != MPP_OK) {
                  return MVar14;
                }
                currSlice->delta_pic_order_cnt[1] = _out;
              }
              else {
                currSlice->delta_pic_order_cnt[1] = 0;
              }
            }
            else {
              currSlice->delta_pic_order_cnt[0] = 0;
              currSlice->delta_pic_order_cnt[1] = 0;
            }
          }
          currSlice->poc_used_bitlen =
               ((phVar9->bitctx).used_bits - iVar20) +
               ((int)RVar13 - (int)(phVar9->bitctx).emulation_prevention_bytes_) * 8;
          phVar17 = currSlice->p_Vid;
          if ((((byte)h264d_debug & 2) != 0) &&
             (phVar17->active_pps->redundant_pic_cnt_present_flag != 0)) {
            _mpp_log_l(2,"h264d_slice","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag == 0",
                       "process_slice",0x22d);
            if ((mpp_debug._3_1_ & 0x10) != 0) {
              abort();
            }
            phVar17 = currSlice->p_Vid;
          }
          if (phVar17->active_pps->redundant_pic_cnt_present_flag != 0) {
            MVar14 = mpp_read_ue(bitctx,&_out);
            (phVar9->bitctx).ret = MVar14;
            if (MVar14 != MPP_OK) {
              return MVar14;
            }
            currSlice->redundant_pic_cnt = _out;
          }
          uVar15 = currSlice->slice_type;
          if (uVar15 == 1) {
            MVar14 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
            (phVar9->bitctx).ret = MVar14;
            if (MVar14 != MPP_OK) {
              return MVar14;
            }
            currSlice->direct_spatial_mv_pred_flag = _out;
            uVar15 = currSlice->slice_type;
          }
          else {
            currSlice->direct_spatial_mv_pred_flag = 0;
          }
          phVar11 = currSlice->p_Vid->active_pps;
          currSlice->num_ref_idx_active[0] = phVar11->num_ref_idx_l0_default_active_minus1 + 1;
          currSlice->num_ref_idx_active[1] = phVar11->num_ref_idx_l1_default_active_minus1 + 1;
          if ((uVar15 < 4) && (uVar15 != 2)) {
            MVar14 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
            (phVar9->bitctx).ret = MVar14;
            if (MVar14 != MPP_OK) {
              return MVar14;
            }
            currSlice->num_ref_idx_override_flag = _out;
            if (_out != 0) {
              MVar14 = mpp_read_ue(bitctx,&_out);
              (phVar9->bitctx).ret = MVar14;
              if (MVar14 != MPP_OK) {
                return MVar14;
              }
              currSlice->num_ref_idx_active[0] = _out + 1;
              if (currSlice->slice_type != 1) goto LAB_0018e43c;
              MVar14 = mpp_read_ue(bitctx,&_out);
              (phVar9->bitctx).ret = MVar14;
              if (MVar14 != MPP_OK) {
                return MVar14;
              }
              currSlice->num_ref_idx_active[1] = _out + 1;
            }
            if (currSlice->slice_type != 1) goto LAB_0018e43c;
          }
          else {
LAB_0018e43c:
            currSlice->num_ref_idx_active[1] = 0;
          }
          MVar14 = ref_pic_list_mvc_modification(currSlice);
          if (MVar14 < MPP_OK) {
            if (((byte)h264d_debug & 4) == 0) {
              return MVar14;
            }
            uVar23 = 0x249;
          }
          else {
            phVar11 = currSlice->p_Vid->active_pps;
            if ((((phVar11->weighted_pred_flag == 0) ||
                 ((currSlice->slice_type != 0 && (currSlice->slice_type != 3)))) &&
                ((phVar11->weighted_bipred_idc != 1 || (currSlice->slice_type != 1)))) ||
               (MVar14 = pred_weight_table(currSlice), MPP_NOK < MVar14)) {
              currSlice->drpm_used_bitlen = 0;
              if ((currSlice->nal_reference_idc == 0) ||
                 (MVar14 = dec_ref_pic_marking(currSlice), MPP_NOK < MVar14)) {
                if (((byte)h264d_debug & 0x20) == 0) {
                  return MPP_OK;
                }
                _mpp_log_l(4,"h264d_slice",
                           "[SLICE_HEAD] type=%d, layer_id=%d,sps_id=%d, pps_id=%d, struct=%d, frame_num=%d"
                           ,(char *)0x0,(ulong)(uint)currSlice->slice_type,
                           (ulong)(uint)currSlice->layer_id,
                           (ulong)currSlice->active_sps->seq_parameter_set_id,
                           (ulong)currSlice->active_pps->pic_parameter_set_id,
                           (ulong)(uint)currSlice->structure,(ulong)(uint)currSlice->frame_num);
                return MPP_OK;
              }
              if (((byte)h264d_debug & 4) == 0) {
                return MVar14;
              }
              uVar23 = 0x251;
            }
            else {
              if (((byte)h264d_debug & 4) == 0) {
                return MVar14;
              }
              uVar23 = 0x24d;
            }
          }
          goto LAB_0018dabf;
        }
        if (((byte)h264d_debug & 4) != 0) {
          pcVar19 = "Function error(%d).\n";
          uVar23 = 0x18c;
          goto LAB_0018da8d;
        }
      }
    }
    else {
      if (((byte)h264d_debug & 1) != 0) {
        pcVar19 = "sps has error, sps_id=%d";
LAB_0018dc20:
        _mpp_log_l(4,"h264d_slice",pcVar19,(char *)0x0);
      }
LAB_0018dcf6:
      MVar14 = MPP_ERR_VALUE;
      if (((byte)h264d_debug & 4) != 0) {
        pcVar19 = "value error(%d).\n";
        uVar23 = 0x189;
        goto LAB_0018da8d;
      }
    }
  }
  else {
    MVar14 = MPP_ERR_VALUE;
    if (((byte)h264d_debug & 4) == 0) goto LAB_0018da94;
    pcVar19 = "value error(%d).\n";
    uVar23 = 0x167;
LAB_0018da8d:
    _mpp_log_l(4,"h264d_slice",pcVar19,(char *)0x0,uVar23);
  }
LAB_0018da94:
  if (((byte)h264d_debug & 4) == 0) {
    return MVar14;
  }
  uVar23 = 0x1e7;
LAB_0018dabf:
  _mpp_log_l(4,"h264d_slice","Function error(%d).\n",(char *)0x0,uVar23);
  return MVar14;
}

Assistant:

MPP_RET process_slice(H264_SLICE_t *currSlice)
{
    RK_U32 temp = 0;
    RK_U32 poc_used_bits = 0;
    RK_U32 emulation_prevention = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dVideoCtx_t *p_Vid = currSlice->p_Vid;
    H264dCurCtx_t *p_Cur = currSlice->p_Cur;
    BitReadCtx_t *p_bitctx = &p_Cur->bitctx;
    RecoveryPoint *recovery = &p_Vid->recovery;

    //!< initial value
    currSlice->p_Dpb_layer[0] = p_Vid->p_Dpb_layer[0];
    currSlice->p_Dpb_layer[1] = p_Vid->p_Dpb_layer[1];

    //!< read slice head syntax
    READ_UE(p_bitctx, &currSlice->start_mb_nr); //!< first_mb_in_slice
    READ_UE(p_bitctx, &temp); //!< slice_type
    p_Vid->slice_type = currSlice->slice_type = temp % 5;
    if (p_Vid->slice_type == H264_SP_SLICE || p_Vid->slice_type == H264_SI_SLICE) {
        H264D_WARNNING("sp or si slice not support\n");
        goto __FAILED;
    }
    READ_UE(p_bitctx, &currSlice->pic_parameter_set_id);
    init_slice_parmeters(currSlice);
    FUN_CHECK(ret = set_slice_user_parmeters(currSlice));
    //!< read rest slice header syntax
    {
        READ_BITS(p_bitctx, currSlice->active_sps->log2_max_frame_num_minus4 + 4, &currSlice->frame_num);

        if (recovery->valid_flag) {
            if (!recovery->first_frm_valid) {
                recovery->first_frm_id = currSlice->frame_num;
                recovery->first_frm_valid = 1;
                recovery->recovery_pic_id = recovery->first_frm_id + recovery->recovery_frame_cnt;
                H264D_DBG(H264D_DBG_SEI, "First recovery frame found, frame_num %d", currSlice->frame_num);
            } else {
                // It may be too early to reset recovery point info when frame_num is wrapped
                if (recovery->recovery_pic_id % p_Vid->max_frame_num < currSlice->frame_num)
                    memset(&p_Vid->recovery, 0, sizeof(RecoveryPoint));
            }
        }

        if (currSlice->active_sps->frame_mbs_only_flag) { //!< user in_slice info
            p_Vid->structure = FRAME;
            currSlice->field_pic_flag = 0;
            currSlice->bottom_field_flag = 0;
        } else {
            READ_ONEBIT(p_bitctx, &currSlice->field_pic_flag);
            if (currSlice->field_pic_flag) {
                READ_ONEBIT(p_bitctx, &currSlice->bottom_field_flag);
                p_Vid->structure = currSlice->bottom_field_flag ? BOTTOM_FIELD : TOP_FIELD;
            } else {
                p_Vid->structure = FRAME;
                currSlice->bottom_field_flag = 0;
            }
        }
        currSlice->structure = p_Vid->structure;
        currSlice->mb_aff_frame_flag = currSlice->active_sps->mb_adaptive_frame_field_flag &&
                                       !currSlice->field_pic_flag;
        if (currSlice->idr_flag) {
            READ_UE(p_bitctx, &currSlice->idr_pic_id);
        } else if (currSlice->svc_extension_flag == 0 && currSlice->mvcExt.non_idr_flag == 0) {
            READ_UE(p_bitctx, &currSlice->idr_pic_id);
        }
        poc_used_bits = p_bitctx->used_bits; //!< init poc used bits
        emulation_prevention = p_bitctx->emulation_prevention_bytes_;
        if (currSlice->active_sps->pic_order_cnt_type == 0) {
            READ_BITS(p_bitctx, currSlice->active_sps->log2_max_pic_order_cnt_lsb_minus4 + 4, &currSlice->pic_order_cnt_lsb);
            if (currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1
                && !currSlice->field_pic_flag) {
                READ_SE(p_bitctx, &currSlice->delta_pic_order_cnt_bottom);
            } else {
                currSlice->delta_pic_order_cnt_bottom = 0;
            }
        }
        if (currSlice->active_sps->pic_order_cnt_type == 1) {
            if (!currSlice->active_sps->delta_pic_order_always_zero_flag) {
                READ_SE(p_bitctx, &currSlice->delta_pic_order_cnt[0]);

                if (currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1 && !currSlice->field_pic_flag) {
                    READ_SE(p_bitctx, &currSlice->delta_pic_order_cnt[1]);
                } else {
                    currSlice->delta_pic_order_cnt[1] = 0;  //!< set to zero if not in stream
                }
            } else {
                currSlice->delta_pic_order_cnt[0] = 0;
                currSlice->delta_pic_order_cnt[1] = 0;
            }
        }

        // need to minus emulation prevention bytes(0x000003) we met
        emulation_prevention = p_bitctx->emulation_prevention_bytes_ - emulation_prevention;
        currSlice->poc_used_bitlen = p_bitctx->used_bits - poc_used_bits - (emulation_prevention * 8); //!< calculate poc used bit length
        //!< redundant_pic_cnt is missing here
        ASSERT(currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag == 0); // add by dw, high 4:2:2 profile not support
        if (currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag) {
            READ_UE(p_bitctx, &currSlice->redundant_pic_cnt);
        }

        if (currSlice->slice_type == H264_B_SLICE) {
            READ_ONEBIT(p_bitctx, &currSlice->direct_spatial_mv_pred_flag);
        } else {
            currSlice->direct_spatial_mv_pred_flag = 0;
        }
        currSlice->num_ref_idx_active[LIST_0] = currSlice->p_Vid->active_pps->num_ref_idx_l0_default_active_minus1 + 1;
        currSlice->num_ref_idx_active[LIST_1] = currSlice->p_Vid->active_pps->num_ref_idx_l1_default_active_minus1 + 1;

        if (currSlice->slice_type == H264_P_SLICE
            || currSlice->slice_type == H264_SP_SLICE || currSlice->slice_type == H264_B_SLICE) {
            READ_ONEBIT(p_bitctx, &currSlice->num_ref_idx_override_flag);
            if (currSlice->num_ref_idx_override_flag) {
                READ_UE(p_bitctx, &currSlice->num_ref_idx_active[LIST_0]);
                currSlice->num_ref_idx_active[LIST_0] += 1;
                if (currSlice->slice_type == H264_B_SLICE) {
                    READ_UE(p_bitctx, &currSlice->num_ref_idx_active[LIST_1]);
                    currSlice->num_ref_idx_active[LIST_1] += 1;
                }
            }
        }
        if (currSlice->slice_type != H264_B_SLICE) {
            currSlice->num_ref_idx_active[LIST_1] = 0;
        }
        FUN_CHECK(ret = ref_pic_list_mvc_modification(currSlice));
        if ((currSlice->p_Vid->active_pps->weighted_pred_flag
             && (currSlice->slice_type == H264_P_SLICE || currSlice->slice_type == H264_SP_SLICE))
            || (currSlice->p_Vid->active_pps->weighted_bipred_idc == 1 && (currSlice->slice_type == H264_B_SLICE))) {
            FUN_CHECK(ret = pred_weight_table(currSlice));
        }
        currSlice->drpm_used_bitlen = 0;
        if (currSlice->nal_reference_idc) {
            FUN_CHECK(ret = dec_ref_pic_marking(currSlice));
        }
        H264D_DBG(H264D_DBG_PPS_SPS, "[SLICE_HEAD] type=%d, layer_id=%d,sps_id=%d, pps_id=%d, struct=%d, frame_num=%d",
                  currSlice->slice_type, currSlice->layer_id, currSlice->active_sps->seq_parameter_set_id,
                  currSlice->active_pps->pic_parameter_set_id, currSlice->structure, currSlice->frame_num);
    }

    return ret = MPP_OK;
__BITREAD_ERR:
    ret = p_bitctx->ret;
__FAILED:
    return ret;
}